

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O1

string * __thiscall Parameter<bool>::getParamType_abi_cxx11_(Parameter<bool> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x6c6f6f62;
  in_RDI->_M_string_length = 4;
  (in_RDI->field_2)._M_local_buf[4] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }